

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubDEdgePtr ON_SubDEdge::FromVertices(ON_SubDVertex *vertex0,ON_SubDVertex *vertex1)

{
  ulong in_RAX;
  ON_SubDVertex *pOVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  
  if ((((vertex0 != vertex1) && (vertex0 != (ON_SubDVertex *)0x0)) &&
      (vertex1 != (ON_SubDVertex *)0x0)) && (vertex0->m_edges != (ON_SubDEdgePtr *)0x0)) {
    uVar2 = (ulong)vertex0->m_edge_count;
    bVar5 = uVar2 != 0;
    if (bVar5) {
      uVar3 = 1;
      do {
        in_RAX = vertex0->m_edges[uVar3 - 1].m_ptr;
        uVar4 = in_RAX & 0xfffffffffffffff8;
        if (uVar4 == 0) {
          pOVar1 = (ON_SubDVertex *)0x0;
        }
        else {
          pOVar1 = *(ON_SubDVertex **)(uVar4 + 0x80 + (ulong)(~(uint)in_RAX & 1) * 8);
        }
        if (pOVar1 == vertex1) {
          if (uVar4 == 0) {
            pOVar1 = (ON_SubDVertex *)0x0;
          }
          else {
            pOVar1 = *(ON_SubDVertex **)(uVar4 + 0x80 + (ulong)((uint)in_RAX & 1) * 8);
          }
          if (pOVar1 == vertex0) break;
        }
        bVar5 = uVar3 < uVar2;
        bVar6 = uVar3 != uVar2;
        uVar3 = uVar3 + 1;
      } while (bVar6);
    }
    if (bVar5) {
      return (ON_SubDEdgePtr)in_RAX;
    }
  }
  return (ON_SubDEdgePtr)0;
}

Assistant:

const ON_SubDEdgePtr ON_SubDEdge::FromVertices(
  const ON_SubDVertex* vertex0,
  const ON_SubDVertex* vertex1
)
{
  if (nullptr != vertex0 && nullptr != vertex1 && vertex0 != vertex1 && nullptr != vertex0->m_edges)
  {
    for (unsigned short vei = 0; vei < vertex0->m_edge_count; vei++)
    {
      const ON_SubDEdgePtr eptr = vertex0->m_edges[vei];
      if (vertex1 == eptr.RelativeVertex(1) && vertex0 == eptr.RelativeVertex(0))
        return eptr;
    }
  }
  return ON_SubDEdgePtr::Null;
}